

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O0

void __thiscall
trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::step
          (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this)

{
  uint mask_D;
  lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this_local;
  
  (this->S).index = (this->S).index + 1;
  (this->S).index = (this->S).index & 0x3ff;
  (this->S).r[(this->S).index] =
       (this->S).r[(this->S).index - 0xa8 & 0x3ff] ^ (this->S).r[(this->S).index - 0xcd & 0x3ff] ^
       (this->S).r[(this->S).index - 0xf2 & 0x3ff] ^ (this->S).r[(this->S).index - 0x209 & 0x3ff];
  return;
}

Assistant:

void step() {
      constexpr auto mask_D{int_math::mask(static_cast<decltype(S.index)>(D))};
      ++S.index;
      S.index &= mask_D;
      S.r[S.index] = S.r[(S.index - A) & mask_D] ^ S.r[(S.index - B) & mask_D] ^
                     S.r[(S.index - C) & mask_D] ^ S.r[(S.index - D) & mask_D];
    }